

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanLogicalDevice.cpp
# Opt level: O3

VkResult __thiscall
VulkanUtilities::VulkanLogicalDevice::ResetCommandPool
          (VulkanLogicalDevice *this,VkCommandPool vkCmdPool,VkCommandPoolResetFlags flags)

{
  VkResult VVar1;
  string msg;
  string local_30;
  
  VVar1 = (*vkResetCommandPool)(this->m_VkDevice,vkCmdPool,flags);
  if (VVar1 != VK_SUCCESS) {
    Diligent::FormatString<char[29]>(&local_30,(char (*) [29])"Failed to reset command pool");
    Diligent::DebugAssertionFailed
              (local_30._M_dataplus._M_p,"ResetCommandPool",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanLogicalDevice.cpp"
               ,0x2c2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  return VVar1;
}

Assistant:

VkResult VulkanLogicalDevice::ResetCommandPool(VkCommandPool           vkCmdPool,
                                               VkCommandPoolResetFlags flags) const
{
    VkResult err = vkResetCommandPool(m_VkDevice, vkCmdPool, flags);
    DEV_CHECK_ERR(err == VK_SUCCESS, "Failed to reset command pool");
    return err;
}